

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O3

void __thiscall Unit::dimensionless(Unit *this)

{
  byte bVar1;
  byte bVar2;
  ostream *poVar3;
  long lVar4;
  bool bVar5;
  
  setNames(this);
  lVar4 = 1;
  bVar2 = 0;
  do {
    bVar1 = bVar2;
    bVar5 = this->siUnits[lVar4 + -1] != 0;
    this->siUnits[lVar4 + -1] = 0;
    lVar4 = lVar4 + 1;
    bVar2 = bVar1 | bVar5;
  } while (lVar4 != 8);
  if ((bool)(bVar1 | bVar5)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"warning: using(",0xf);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->sUnitName)._M_dataplus._M_p,
                        (this->sUnitName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,") as argument to a dimensionless function.",0x2a);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  setNames(this);
  return;
}

Assistant:

void Unit::dimensionless()
{
	setNames();
	bool warning = false;
	for(int i=0; i<7; i++) {
		if (siUnits[i])
			warning = true;
		siUnits[i] = 0;
	}
	if (warning)
		cout << "warning: using(" << sUnitName << ") as argument to a dimensionless function." << endl;
	setNames();
}